

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str>
          (pybind11 *this,handle *args_,handle *args__1,none *args__2,str *args__3)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  object *poVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  array<pybind11::object,_4UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  argtypes;
  object local_108;
  PyObject *local_100;
  PyObject *local_f8;
  PyObject *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [4];
  
  poVar3 = &local_108;
  pPVar1 = args_->m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_108.super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_108.super_handle.m_ptr = (handle)args_->m_ptr;
  }
  pPVar1 = args__1->m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_100 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_100 = args__1->m_ptr;
  }
  pPVar1 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_f8 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_f8 = (args__2->super_object).super_handle.m_ptr;
  }
  pPVar1 = (args__3->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_f0 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_f0 = (args__3->super_object).super_handle.m_ptr;
  }
  lVar6 = 0;
  do {
    if (*(long *)poVar3 == 0) {
      type_id<pybind11::handle>();
      type_id<pybind11::handle>();
      type_id<pybind11::none>();
      type_id<pybind11::str>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_c8,"make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_a8 - lVar6));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_e8 == plVar5) {
        local_d8 = *plVar5;
        lStack_d0 = plVar4[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar5;
      }
      local_e0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_e8);
      *(undefined ***)this_00 = &PTR__runtime_error_0012aa50;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar6 = lVar6 + -0x20;
    poVar3 = (object *)((long *)poVar3 + 1);
  } while (lVar6 != -0x80);
  tuple::tuple((tuple *)this,4);
  lVar6 = 0;
  do {
    uVar2 = *(undefined8 *)((long)&local_108.super_handle.m_ptr + lVar6);
    *(undefined8 *)((long)&local_108.super_handle.m_ptr + lVar6) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/pybind11/include/pybind11/cast.h"
                    ,0x6f2,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle, pybind11::handle, pybind11::none, pybind11::str>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar6) = uVar2;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  lVar6 = 0x18;
  do {
    object::~object((object *)((long)&local_108.super_handle.m_ptr + lVar6));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}